

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O1

bool __thiscall argvParser::foundAllRequierdArgs(argvParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
  *pvVar2;
  vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
  *pvVar3;
  pointer pcVar4;
  section *__rhs;
  argument *paVar5;
  pointer ppsVar6;
  long *plVar7;
  pointer ppaVar8;
  undefined8 *puVar9;
  size_type *psVar10;
  long lVar11;
  argvParser *paVar12;
  argvParser *this_00;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  string sStack_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_128;
  long *plStack_108;
  ulong uStack_100;
  string sStack_f8;
  string sStack_d8;
  string sStack_b8;
  string sStack_98;
  string sStack_78;
  string sStack_58;
  
  pvVar2 = (this->super_argParserAdvancedConfiguration).newargconfig;
  ppsVar6 = (pvVar2->
            super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar11 = (long)(pvVar2->
                 super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar6;
  bVar16 = lVar11 == 0;
  if (!bVar16) {
    paVar12 = (argvParser *)(lVar11 >> 3);
    this_00 = (argvParser *)0x0;
    do {
      if (bVar16) {
        pcVar13 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        plStack_108 = (long *)((long)pcVar13 + 0x10);
        *(long **)pcVar13 = plStack_108;
        *(long *)((long)pcVar13 + 8) = 0;
        *(undefined1 *)((long)pcVar13 + 0x10) = 0;
        bStack_148._M_dataplus._M_p = (pointer)&bStack_148.field_2;
        pcVar4 = (this_00->super_argParserAdvancedConfiguration).applicationName._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&bStack_148,pcVar4,
                   pcVar4 + (this_00->super_argParserAdvancedConfiguration).applicationName.
                            _M_string_length);
        std::__cxx11::string::append((char *)&bStack_148);
        std::__cxx11::string::_M_append(pcVar13,(ulong)bStack_148._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)bStack_148._M_dataplus._M_p != &bStack_148.field_2) {
          operator_delete(bStack_148._M_dataplus._M_p);
        }
        bStack_148._M_dataplus._M_p = (pointer)&bStack_148.field_2;
        pcVar4 = (this_00->description)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&bStack_148,pcVar4,pcVar4 + (this_00->description)._M_string_length);
        std::__cxx11::string::append((char *)&bStack_148);
        std::__cxx11::string::_M_append(pcVar13,(ulong)bStack_148._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)bStack_148._M_dataplus._M_p != &bStack_148.field_2) {
          operator_delete(bStack_148._M_dataplus._M_p);
        }
        bStack_148._M_dataplus._M_p = (pointer)&bStack_148.field_2;
        bStack_148._M_string_length = 0;
        bStack_148.field_2._M_local_buf[0] = '\0';
        pvVar2 = (this_00->super_argParserAdvancedConfiguration).newargconfig;
        ppsVar6 = (pvVar2->
                  super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((pvVar2->
            super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
            )._M_impl.super__Vector_impl_data._M_finish != ppsVar6) {
          paVar1 = &sStack_168.field_2;
          uVar14 = 0;
          do {
            __rhs = ppsVar6[uVar14];
            if ((__rhs->sectionName)._M_string_length != 0) {
              std::operator+(&bStack_128," ",&__rhs->sectionName);
              plVar7 = (long *)std::__cxx11::string::append((char *)&bStack_128);
              psVar10 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                sStack_168.field_2._M_allocated_capacity = *psVar10;
                sStack_168.field_2._8_8_ = plVar7[3];
                sStack_168._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                sStack_168.field_2._M_allocated_capacity = *psVar10;
                sStack_168._M_dataplus._M_p = (pointer)*plVar7;
              }
              sStack_168._M_string_length = plVar7[1];
              *plVar7 = (long)psVar10;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::__cxx11::string::_M_append(pcVar13,(ulong)sStack_168._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)sStack_168._M_dataplus._M_p != paVar1) {
                operator_delete(sStack_168._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)bStack_128._M_dataplus._M_p != &bStack_128.field_2) {
                operator_delete(bStack_128._M_dataplus._M_p);
              }
            }
            ppaVar8 = (__rhs->arguments->
                      super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uStack_100 = uVar14;
            if ((__rhs->arguments->
                super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                )._M_impl.super__Vector_impl_data._M_finish != ppaVar8) {
              uVar14 = 0;
              do {
                paVar5 = ppaVar8[uVar14];
                sStack_98._M_dataplus._M_p = (pointer)&sStack_98.field_2;
                pcVar4 = (paVar5->argShort)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&sStack_98,pcVar4,pcVar4 + (paVar5->argShort)._M_string_length)
                ;
                sStack_b8._M_dataplus._M_p = (pointer)&sStack_b8.field_2;
                pcVar4 = (paVar5->argLong)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&sStack_b8,pcVar4,pcVar4 + (paVar5->argLong)._M_string_length);
                sStack_58._M_dataplus._M_p = (pointer)&sStack_58.field_2;
                pcVar4 = (paVar5->helpMessage)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&sStack_58,pcVar4,
                           pcVar4 + (paVar5->helpMessage)._M_string_length);
                argParserAdvancedConfiguration::buildHelpLine
                          (&sStack_168,&this_00->super_argParserAdvancedConfiguration,&sStack_98,
                           &sStack_b8,&sStack_58);
                std::__cxx11::string::_M_append(pcVar13,(ulong)sStack_168._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)sStack_168._M_dataplus._M_p != paVar1) {
                  operator_delete(sStack_168._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)sStack_58._M_dataplus._M_p != &sStack_58.field_2) {
                  operator_delete(sStack_58._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)sStack_b8._M_dataplus._M_p != &sStack_b8.field_2) {
                  operator_delete(sStack_b8._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)sStack_98._M_dataplus._M_p != &sStack_98.field_2) {
                  operator_delete(sStack_98._M_dataplus._M_p);
                }
                if (paVar5->requiredAndNotHitJet == true) {
                  sStack_d8._M_dataplus._M_p = (pointer)&sStack_d8.field_2;
                  pcVar4 = (paVar5->argShort)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&sStack_d8,pcVar4,
                             pcVar4 + (paVar5->argShort)._M_string_length);
                  sStack_f8._M_dataplus._M_p = (pointer)&sStack_f8.field_2;
                  pcVar4 = (paVar5->argLong)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&sStack_f8,pcVar4,pcVar4 + (paVar5->argLong)._M_string_length
                            );
                  sStack_78._M_dataplus._M_p = (pointer)&sStack_78.field_2;
                  pcVar4 = (paVar5->helpMessage)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&sStack_78,pcVar4,
                             pcVar4 + (paVar5->helpMessage)._M_string_length);
                  argParserAdvancedConfiguration::buildHelpLine
                            (&sStack_168,&this_00->super_argParserAdvancedConfiguration,&sStack_d8,
                             &sStack_f8,&sStack_78);
                  std::__cxx11::string::_M_append
                            ((char *)&bStack_148,(ulong)sStack_168._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)sStack_168._M_dataplus._M_p != paVar1) {
                    operator_delete(sStack_168._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)sStack_78._M_dataplus._M_p != &sStack_78.field_2) {
                    operator_delete(sStack_78._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)sStack_f8._M_dataplus._M_p != &sStack_f8.field_2) {
                    operator_delete(sStack_f8._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)sStack_d8._M_dataplus._M_p != &sStack_d8.field_2) {
                    operator_delete(sStack_d8._M_dataplus._M_p);
                  }
                }
                uVar14 = uVar14 + 1;
                ppaVar8 = (__rhs->arguments->
                          super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                          )._M_impl.super__Vector_impl_data._M_start;
              } while (uVar14 < (ulong)((long)(__rhs->arguments->
                                              super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppaVar8 >> 3));
            }
            uVar14 = uStack_100 + 1;
            pvVar2 = (this_00->super_argParserAdvancedConfiguration).newargconfig;
            ppsVar6 = (pvVar2->
                      super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          } while (uVar14 < (ulong)((long)(pvVar2->
                                          super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppsVar6 >> 3));
        }
        bVar16 = foundAllRequierdArgs(this_00);
        if (!bVar16) {
          std::operator+(&bStack_128,"\nrequired arguments are : \n",&bStack_148);
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&bStack_128);
          psVar10 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            sStack_168.field_2._M_allocated_capacity = *psVar10;
            sStack_168.field_2._8_8_ = puVar9[3];
            sStack_168._M_dataplus._M_p = (pointer)&sStack_168.field_2;
          }
          else {
            sStack_168.field_2._M_allocated_capacity = *psVar10;
            sStack_168._M_dataplus._M_p = (pointer)*puVar9;
          }
          sStack_168._M_string_length = puVar9[1];
          *puVar9 = psVar10;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          std::__cxx11::string::_M_append(pcVar13,(ulong)sStack_168._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sStack_168._M_dataplus._M_p != &sStack_168.field_2) {
            operator_delete(sStack_168._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)bStack_128._M_dataplus._M_p != &bStack_128.field_2) {
            operator_delete(bStack_128._M_dataplus._M_p);
          }
        }
        if ((this_00->super_argParserAdvancedConfiguration).lastFailedArg._M_string_length != 0) {
          std::operator+(&sStack_168,"failed argument : ",
                         &(this_00->super_argParserAdvancedConfiguration).lastFailedArg);
          std::__cxx11::string::_M_append(pcVar13,(ulong)sStack_168._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sStack_168._M_dataplus._M_p != &sStack_168.field_2) {
            operator_delete(sStack_168._M_dataplus._M_p);
          }
          if ((this_00->super_argParserAdvancedConfiguration).errorMessage._M_string_length != 0) {
            std::operator+(&sStack_168,"\n  ",
                           &(this_00->super_argParserAdvancedConfiguration).errorMessage);
            std::__cxx11::string::_M_append(pcVar13,(ulong)sStack_168._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_168._M_dataplus._M_p != &sStack_168.field_2) {
              operator_delete(sStack_168._M_dataplus._M_p);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)bStack_148._M_dataplus._M_p != &bStack_148.field_2) {
          operator_delete(bStack_148._M_dataplus._M_p);
        }
        return SUB81(pcVar13,0);
      }
      pvVar3 = ppsVar6[(long)this_00]->arguments;
      lVar11 = *(long *)&(pvVar3->
                         super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                         )._M_impl.super__Vector_impl_data;
      uVar14 = (long)*(pointer *)
                      ((long)&(pvVar3->
                              super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                              )._M_impl.super__Vector_impl_data + 8) - lVar11 >> 3;
      for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
        if (*(char *)(*(long *)(lVar11 + uVar15 * 8) + 0xe8) == '\x01') {
          if (uVar15 < uVar14) {
            return false;
          }
          break;
        }
      }
      this_00 = (argvParser *)
                ((long)&(this_00->super_argParserAdvancedConfiguration).helpMessage._M_dataplus._M_p
                + 1);
      bVar16 = paVar12 <= this_00;
    } while (this_00 !=
             (argvParser *)
             ((long)&(paVar12->super_argParserAdvancedConfiguration).helpMessage._M_dataplus._M_p +
             (ulong)(paVar12 == (argvParser *)0x0)));
  }
  return bVar16;
}

Assistant:

bool argvParser::foundAllRequierdArgs() {
    for (int x = 0; x < newargconfig->size(); x++) {
        for(int y = 0; y<newargconfig->at(x)->arguments->size();y++){
            if (newargconfig->at(x)->arguments->at(y)->requiredAndNotHitJet)
                return false;
        }

    }
    return true;
}